

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.c
# Opt level: O3

void stdout_anything(t_stdout *x,t_symbol *s,int argc,t_atom *argv)

{
  uint uVar1;
  FILE *__s;
  uint uVar2;
  t_symbol *ptVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  word *pwVar8;
  uint argc_00;
  t_float tVar9;
  t_float atStack_10038 [249];
  undefined1 local_fc51;
  
  iVar6 = x->x_mode;
  if (iVar6 == 3) {
    pd_tilde_putsymbol((t_symbol *)s->s_name,(FILE *)_stdout);
    if (argc != 0) {
      pwVar8 = &argv->a_w;
      do {
        __s = _stdout;
        if (((t_atom *)(pwVar8 + -1))->a_type == A_SYMBOL) {
          pd_tilde_putsymbol((t_symbol *)pwVar8->w_symbol->s_name,(FILE *)_stdout);
        }
        else if (((t_atom *)(pwVar8 + -1))->a_type == A_FLOAT) {
          atStack_10038[0] = pwVar8->w_float;
          putc(1,_stdout);
          fwrite(atStack_10038,4,1,__s);
        }
        argc = argc + -1;
        pwVar8 = pwVar8 + 2;
      } while (argc != 0);
    }
    putc(4,_stdout);
    if (x->x_flush == 0) {
      return;
    }
    fflush(_stdout);
    return;
  }
  if (iVar6 == 2) {
    ptVar3 = gensym("list");
    if (((ptVar3 != s) && (ptVar3 = gensym("float"), ptVar3 != s)) &&
       (ptVar3 = gensym("bang"), ptVar3 != s)) {
      pd_error(x,"stdout: only \'list\' messages allowed in binary mode (got \'%s\')",s->s_name);
      return;
    }
    argc_00 = 0xffff;
    if (argc < 0xffff) {
      argc_00 = argc;
    }
    if (argc < 1) {
      uVar2 = 0;
    }
    else {
      uVar7 = 0;
      do {
        tVar9 = atom_getfloatarg((int)uVar7,argc_00,argv);
        *(char *)((long)atStack_10038 + uVar7) = (char)(int)tVar9;
        uVar7 = uVar7 + 1;
        uVar2 = argc_00;
      } while (argc_00 != uVar7);
    }
    uVar1 = 0xfffe;
    if (uVar2 < 0xfffe) {
      uVar1 = uVar2;
    }
    *(undefined1 *)((long)atStack_10038 + (ulong)uVar1) = 0;
    fwrite(atStack_10038,1,(long)(int)argc_00,_stdout);
    if (argc == 0) goto LAB_001b41be;
    iVar6 = x->x_flush;
  }
  else {
    strncpy((char *)atStack_10038,s->s_name,1000);
    local_fc51 = 0;
    if (argc != 0) {
      sVar4 = strlen((char *)atStack_10038);
      do {
        if ((long)sVar4 < 999) {
          *(undefined2 *)((long)atStack_10038 + sVar4) = 0x20;
          sVar4 = sVar4 + 1;
        }
        argc = argc + -1;
        atom_string(argv,(char *)((long)atStack_10038 + sVar4),1000 - (int)sVar4);
        sVar5 = strlen((char *)((long)atStack_10038 + sVar4));
        sVar4 = sVar4 + sVar5;
        argv = argv + 1;
      } while (argc != 0);
      iVar6 = x->x_mode;
    }
    if (iVar6 == 1) {
      puts((char *)atStack_10038);
    }
    else {
      printf("%s;\n",atStack_10038);
    }
    iVar6 = x->x_flush;
  }
  if (iVar6 == 0) {
    return;
  }
LAB_001b41be:
  fflush(_stdout);
  return;
}

Assistant:

static void stdout_anything(t_stdout *x, t_symbol *s, int argc, t_atom *argv)
{
    char msgbuf[MAXPDSTRING], *sp, *ep = msgbuf+MAXPDSTRING;
    if (x->x_mode == MODE_BIN)
    {
        if ((gensym("list") == s) || (gensym("float") == s) ||
            (gensym("bang") == s))
                stdout_binary(x, argc, argv);
        else
            pd_error(x,
 "stdout: only 'list' messages allowed in binary mode (got '%s')",
                s->s_name);
        return;
    }
    else if (x->x_mode == MODE_PDTILDE)
    {
        pd_tilde_putsymbol(s, stdout);
        for (; argc--; argv++)
        {
            if (argv->a_type == A_FLOAT)
                pd_tilde_putfloat(argv->a_w.w_float, stdout);
            else if (argv->a_type == A_SYMBOL)
                pd_tilde_putsymbol(argv->a_w.w_symbol, stdout);
        }
        putc(A_SEMI, stdout);
        if (x->x_flush)
            fflush(stdout);
        return;
    }
    msgbuf[0] = 0;
    strncpy(msgbuf, s->s_name, MAXPDSTRING);
    msgbuf[MAXPDSTRING-1] = 0;
    sp = msgbuf + strlen(msgbuf);
    while (argc--)
    {
        if (sp < ep-1)
            sp[0] = ' ', sp[1] = 0, sp++;
        atom_string(argv++, sp, (unsigned int)(ep-sp));
        sp += strlen(sp);
    }
    switch(x->x_mode) {
    case MODE_CR:
        printf("%s\n", msgbuf);
        break;
    default:
        printf("%s;\n", msgbuf);
    }
    if (x->x_flush)
        fflush(stdout);
}